

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fullsearch.cpp
# Opt level: O1

int __thiscall FullSearch::search(FullSearch *this,Board *board)

{
  Position pos;
  Position *pPVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  Position *pPVar8;
  vector<Position,_std::allocator<Position>_> possibleChoose;
  Board tmpBoard;
  vector<Position,_std::allocator<Position>_> local_a0;
  Board local_88;
  
  if (board->gameEnd != true) goto LAB_0010531a;
  Board::countBoard(&local_88);
  bVar7 = false;
  iVar5 = 0;
  if (local_88.direction[0].col != local_88.direction[0].row) {
    if (board->nowPlayer == 0) {
      bVar7 = local_88.direction[0].row < local_88.direction[0].col;
    }
    else {
      if (board->nowPlayer != 1) {
        bVar7 = true;
        goto LAB_00105312;
      }
      bVar7 = local_88.direction[0].col < local_88.direction[0].row;
    }
    iVar5 = (uint)bVar7 * 2 + -1;
    bVar7 = false;
  }
LAB_00105312:
  if (!bVar7) {
    return iVar5;
  }
LAB_0010531a:
  Board::findPossibleChoose(&local_a0,board);
  if (local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar7 = false;
    uVar6 = 1;
  }
  else {
    bVar3 = 0;
    pPVar1 = local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pPVar8 = pPVar1 + 1;
      pos = *pPVar1;
      Board::Board(&local_88,board);
      Board::doChoose(&local_88,pos);
      iVar2 = search(this,&local_88);
      iVar5 = -iVar2;
      if (2 < iVar2 + 1U) {
        iVar5 = iVar2;
      }
      if (local_88.nowPlayer == board->nowPlayer) {
        iVar5 = iVar2;
      }
      bVar4 = bVar3;
      if (iVar5 == 0) {
        bVar4 = 1;
      }
      bVar7 = false;
      if (iVar5 == 1) {
        bVar7 = true;
        bVar4 = bVar3;
        break;
      }
      bVar3 = bVar4;
      pPVar1 = pPVar8;
    } while (pPVar8 != local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    uVar6 = (uint)(~bVar4 & 1);
  }
  iVar5 = -uVar6;
  if (bVar7) {
    iVar5 = 1;
  }
  if (local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_start != (Position *)0x0) {
    operator_delete(local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar5;
}

Assistant:

int FullSearch::search(Board &board) {
    if (board.gameEnd) {
        int whiteNum,blackNum;
        tie(ignore, whiteNum, blackNum) = board.countBoard();
        if (whiteNum == blackNum) {
            return TIE;
        }
        if (board.nowPlayer == Board::BLACK) {
            return blackNum > whiteNum ? WIN : LOST;
        }
        if (board.nowPlayer == Board::WHITE) {
            return blackNum < whiteNum ? WIN : LOST;
        }
    }
    bool isAbleToTie = false;
    bool isAbleToWin = false;

    vector<Position> possibleChoose = board.findPossibleChoose();
    for (Position choose : possibleChoose) {
        Board tmpBoard = board;
        tmpBoard.doChoose(choose);
        int value = search(tmpBoard);

        //这里胜负正好相反，下一手赢了，说明当前手输了。
        if (tmpBoard.nowPlayer != board.nowPlayer) {
            switch (value) {
                case WIN:
                    value = LOST;
                    break;
                case LOST:
                    value = WIN;
                    break;
                case TIE:
                    value = TIE;
                    break;
            }
        }
        // if(board.nowPlayer == Board::WHITE){
        //     printf("%d\n", value);
        // }

        if (value == WIN) {
            isAbleToWin = true;
            //已经找到赢的路了，剪枝
            break;
        } else if (value == TIE) {
            isAbleToTie = true;
        }
    }
    if (isAbleToWin) {
        return WIN;
    } else if (isAbleToTie) {
        return TIE;
    } else {
        return LOST;
    }
}